

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

int __thiscall
zmq::options_t::getsockopt
          (options_t *this,int __fd,int __level,int __optname,void *__optval,socklen_t *__optlen)

{
  int iVar1;
  int *piVar2;
  undefined4 in_register_0000000c;
  long *plVar3;
  string *value_;
  undefined4 in_register_00000014;
  size_t *optvallen_;
  bool bVar4;
  int *value;
  bool is_int;
  void *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined7 in_stack_ffffffffffffffd0;
  
  optvallen_ = (size_t *)CONCAT44(in_register_00000014,__level);
  plVar3 = (long *)CONCAT44(in_register_0000000c,__optname);
  bVar4 = *plVar3 == 4;
  value_ = (string *)(ulong)(__fd - 4);
  switch(value_) {
  case (string *)0x0:
    if (*plVar3 == 8) {
      *optvallen_ = this->affinity;
      return 0;
    }
    break;
  case (string *)0x1:
    iVar1 = do_getsockopt(this,(size_t *)
                               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8,0x2bc5f6);
    return iVar1;
  default:
    break;
  case (string *)0x4:
    if (bVar4) {
      *(int *)optvallen_ = this->rate;
      return 0;
    }
    break;
  case (string *)0x5:
    if (bVar4) {
      *(int *)optvallen_ = this->recovery_ivl;
      return 0;
    }
    break;
  case (string *)0x7:
    if (bVar4) {
      *(int *)optvallen_ = this->sndbuf;
      return 0;
    }
    break;
  case (string *)0x8:
    if (bVar4) {
      *(int *)optvallen_ = this->rcvbuf;
      return 0;
    }
    break;
  case (string *)0xc:
    if (bVar4) {
      *(int *)optvallen_ = (int)this->type;
      return 0;
    }
    break;
  case (string *)0xd:
    if (bVar4) {
      iVar1 = atomic_value_t::load((atomic_value_t *)this);
      *(int *)optvallen_ = iVar1;
      return 0;
    }
    break;
  case (string *)0xe:
    if (bVar4) {
      *(int *)optvallen_ = this->reconnect_ivl;
      return 0;
    }
    break;
  case (string *)0xf:
    if (bVar4) {
      *(int *)optvallen_ = this->backlog;
      return 0;
    }
    break;
  case (string *)0x11:
    if (bVar4) {
      *(int *)optvallen_ = this->reconnect_ivl_max;
      return 0;
    }
    break;
  case (string *)0x12:
    if (*plVar3 == 8) {
      *optvallen_ = this->maxmsgsize;
      *plVar3 = 8;
      return 0;
    }
    break;
  case (string *)0x13:
    if (bVar4) {
      *(int *)optvallen_ = this->sndhwm;
      return 0;
    }
    break;
  case (string *)0x14:
    if (bVar4) {
      *(int *)optvallen_ = this->rcvhwm;
      return 0;
    }
    break;
  case (string *)0x15:
    if (bVar4) {
      *(int *)optvallen_ = this->multicast_hops;
      return 0;
    }
    break;
  case (string *)0x17:
    if (bVar4) {
      *(int *)optvallen_ = this->rcvtimeo;
      return 0;
    }
    break;
  case (string *)0x18:
    if (bVar4) {
      *(int *)optvallen_ = this->sndtimeo;
      return 0;
    }
    break;
  case (string *)0x1b:
    if (bVar4) {
      *(uint *)optvallen_ = 1 - (uint)(this->ipv6 & 1);
      return 0;
    }
    break;
  case (string *)0x1e:
    if (bVar4) {
      *(int *)optvallen_ = this->tcp_keepalive;
      return 0;
    }
    break;
  case (string *)0x1f:
    if (bVar4) {
      *(int *)optvallen_ = this->tcp_keepalive_cnt;
      return 0;
    }
    break;
  case (string *)0x20:
    if (bVar4) {
      *(int *)optvallen_ = this->tcp_keepalive_idle;
      return 0;
    }
    break;
  case (string *)0x21:
    if (bVar4) {
      *(int *)optvallen_ = this->tcp_keepalive_intvl;
      return 0;
    }
    break;
  case (string *)0x23:
    if (bVar4) {
      *(int *)optvallen_ = this->immediate;
      return 0;
    }
    break;
  case (string *)0x26:
    if (bVar4) {
      *(uint *)optvallen_ = (uint)(this->ipv6 & 1);
      return 0;
    }
    break;
  case (string *)0x27:
    if (bVar4) {
      *(int *)optvallen_ = this->mechanism;
      return 0;
    }
    break;
  case (string *)0x28:
    if (bVar4) {
      bVar4 = false;
      if (this->as_server != 0) {
        bVar4 = this->mechanism == 1;
      }
      *(uint *)optvallen_ = (uint)bVar4;
      return 0;
    }
    break;
  case (string *)0x29:
    iVar1 = do_getsockopt((void *)CONCAT17(bVar4,in_stack_ffffffffffffffd0),optvallen_,value_);
    return iVar1;
  case (string *)0x2a:
    iVar1 = do_getsockopt((void *)CONCAT17(bVar4,in_stack_ffffffffffffffd0),optvallen_,value_);
    return iVar1;
  case (string *)0x32:
    if (bVar4) {
      *(uint *)optvallen_ = (uint)(this->conflate & 1);
      return 0;
    }
    break;
  case (string *)0x33:
    iVar1 = do_getsockopt((void *)CONCAT17(bVar4,in_stack_ffffffffffffffd0),optvallen_,value_);
    return iVar1;
  case (string *)0x35:
    if (bVar4) {
      *(int *)optvallen_ = this->tos;
      return 0;
    }
    break;
  case (string *)0x3e:
    if (bVar4) {
      *(int *)optvallen_ = this->handshake_ivl;
      return 0;
    }
    break;
  case (string *)0x40:
    iVar1 = do_getsockopt((void *)CONCAT17(bVar4,in_stack_ffffffffffffffd0),optvallen_,value_);
    return iVar1;
  case (string *)0x46:
    if (bVar4) {
      *(uint *)optvallen_ = (uint)(this->invert_matching & 1);
      return 0;
    }
    break;
  case (string *)0x47:
    if (bVar4) {
      *(int *)optvallen_ = this->heartbeat_interval;
      return 0;
    }
    break;
  case (string *)0x48:
    if (bVar4) {
      *(uint *)optvallen_ = (uint)this->heartbeat_ttl * 100;
      return 0;
    }
    break;
  case (string *)0x49:
    if (bVar4) {
      *(int *)optvallen_ = this->heartbeat_timeout;
      return 0;
    }
    break;
  case (string *)0x4b:
    if (bVar4) {
      *(int *)optvallen_ = this->connect_timeout;
      return 0;
    }
    break;
  case (string *)0x4c:
    if (bVar4) {
      *(int *)optvallen_ = this->tcp_maxrt;
      return 0;
    }
    break;
  case (string *)0x50:
    if (bVar4) {
      *(int *)optvallen_ = this->multicast_maxtpdu;
      return 0;
    }
    break;
  case (string *)0x55:
    if (bVar4) {
      *(int *)optvallen_ = this->use_fd;
      return 0;
    }
    break;
  case (string *)0x58:
    iVar1 = do_getsockopt((void *)CONCAT17(bVar4,in_stack_ffffffffffffffd0),optvallen_,value_);
    return iVar1;
  case (string *)0x59:
    if (bVar4) {
      *(uint *)optvallen_ = (uint)(this->zap_enforce_domain & 1);
      return 0;
    }
    break;
  case (string *)0x5a:
    if (bVar4) {
      *(uint *)optvallen_ = (uint)(this->loopback_fastpath & 1);
      return 0;
    }
    break;
  case (string *)0x5c:
    if (bVar4) {
      *(uint *)optvallen_ = (uint)(this->multicast_loop & 1);
      return 0;
    }
    break;
  case (string *)0x5d:
    if (bVar4) {
      *(int *)optvallen_ = this->router_notify;
      return 0;
    }
    break;
  case (string *)0x5f:
    iVar1 = do_getsockopt((void *)CONCAT17(bVar4,in_stack_ffffffffffffffd0),optvallen_,value_);
    return iVar1;
  case (string *)0x60:
    iVar1 = do_getsockopt((void *)CONCAT17(bVar4,in_stack_ffffffffffffffd0),optvallen_,value_);
    return iVar1;
  case (string *)0x61:
    if (bVar4) {
      *(int *)optvallen_ = this->in_batch_size;
      return 0;
    }
    break;
  case (string *)0x62:
    if (bVar4) {
      *(int *)optvallen_ = this->out_batch_size;
      return 0;
    }
    break;
  case (string *)0x69:
    if (bVar4) {
      *(int *)optvallen_ = this->reconnect_stop;
      return 0;
    }
    break;
  case (string *)0x6c:
    if (bVar4) {
      *(int *)optvallen_ = this->priority;
      return 0;
    }
  }
  piVar2 = __errno_location();
  *piVar2 = 0x16;
  return -1;
}

Assistant:

int zmq::options_t::getsockopt (int option_,
                                void *optval_,
                                size_t *optvallen_) const
{
    const bool is_int = (*optvallen_ == sizeof (int));
    int *value = static_cast<int *> (optval_);
#if defined(ZMQ_ACT_MILITANT)
    bool malformed = true; //  Did caller pass a bad option value?
#endif

    switch (option_) {
        case ZMQ_SNDHWM:
            if (is_int) {
                *value = sndhwm;
                return 0;
            }
            break;

        case ZMQ_RCVHWM:
            if (is_int) {
                *value = rcvhwm;
                return 0;
            }
            break;

        case ZMQ_AFFINITY:
            if (*optvallen_ == sizeof (uint64_t)) {
                *(static_cast<uint64_t *> (optval_)) = affinity;
                return 0;
            }
            break;

        case ZMQ_ROUTING_ID:
            return do_getsockopt (optval_, optvallen_, routing_id,
                                  routing_id_size);

        case ZMQ_RATE:
            if (is_int) {
                *value = rate;
                return 0;
            }
            break;

        case ZMQ_RECOVERY_IVL:
            if (is_int) {
                *value = recovery_ivl;
                return 0;
            }
            break;

        case ZMQ_SNDBUF:
            if (is_int) {
                *value = sndbuf;
                return 0;
            }
            break;

        case ZMQ_RCVBUF:
            if (is_int) {
                *value = rcvbuf;
                return 0;
            }
            break;

        case ZMQ_TOS:
            if (is_int) {
                *value = tos;
                return 0;
            }
            break;

        case ZMQ_TYPE:
            if (is_int) {
                *value = type;
                return 0;
            }
            break;

        case ZMQ_LINGER:
            if (is_int) {
                *value = linger.load ();
                return 0;
            }
            break;

        case ZMQ_CONNECT_TIMEOUT:
            if (is_int) {
                *value = connect_timeout;
                return 0;
            }
            break;

        case ZMQ_TCP_MAXRT:
            if (is_int) {
                *value = tcp_maxrt;
                return 0;
            }
            break;

        case ZMQ_RECONNECT_STOP:
            if (is_int) {
                *value = reconnect_stop;
                return 0;
            }
            break;

        case ZMQ_RECONNECT_IVL:
            if (is_int) {
                *value = reconnect_ivl;
                return 0;
            }
            break;

        case ZMQ_RECONNECT_IVL_MAX:
            if (is_int) {
                *value = reconnect_ivl_max;
                return 0;
            }
            break;

        case ZMQ_BACKLOG:
            if (is_int) {
                *value = backlog;
                return 0;
            }
            break;

        case ZMQ_MAXMSGSIZE:
            if (*optvallen_ == sizeof (int64_t)) {
                *(static_cast<int64_t *> (optval_)) = maxmsgsize;
                *optvallen_ = sizeof (int64_t);
                return 0;
            }
            break;

        case ZMQ_MULTICAST_HOPS:
            if (is_int) {
                *value = multicast_hops;
                return 0;
            }
            break;

        case ZMQ_MULTICAST_MAXTPDU:
            if (is_int) {
                *value = multicast_maxtpdu;
                return 0;
            }
            break;

        case ZMQ_RCVTIMEO:
            if (is_int) {
                *value = rcvtimeo;
                return 0;
            }
            break;

        case ZMQ_SNDTIMEO:
            if (is_int) {
                *value = sndtimeo;
                return 0;
            }
            break;

        case ZMQ_IPV4ONLY:
            if (is_int) {
                *value = 1 - ipv6;
                return 0;
            }
            break;

        case ZMQ_IPV6:
            if (is_int) {
                *value = ipv6;
                return 0;
            }
            break;

        case ZMQ_IMMEDIATE:
            if (is_int) {
                *value = immediate;
                return 0;
            }
            break;

        case ZMQ_SOCKS_PROXY:
            return do_getsockopt (optval_, optvallen_, socks_proxy_address);

        case ZMQ_SOCKS_USERNAME:
            return do_getsockopt (optval_, optvallen_, socks_proxy_username);

        case ZMQ_SOCKS_PASSWORD:
            return do_getsockopt (optval_, optvallen_, socks_proxy_password);

        case ZMQ_TCP_KEEPALIVE:
            if (is_int) {
                *value = tcp_keepalive;
                return 0;
            }
            break;

        case ZMQ_TCP_KEEPALIVE_CNT:
            if (is_int) {
                *value = tcp_keepalive_cnt;
                return 0;
            }
            break;

        case ZMQ_TCP_KEEPALIVE_IDLE:
            if (is_int) {
                *value = tcp_keepalive_idle;
                return 0;
            }
            break;

        case ZMQ_TCP_KEEPALIVE_INTVL:
            if (is_int) {
                *value = tcp_keepalive_intvl;
                return 0;
            }
            break;

        case ZMQ_MECHANISM:
            if (is_int) {
                *value = mechanism;
                return 0;
            }
            break;

        case ZMQ_PLAIN_SERVER:
            if (is_int) {
                *value = as_server && mechanism == ZMQ_PLAIN;
                return 0;
            }
            break;

        case ZMQ_PLAIN_USERNAME:
            return do_getsockopt (optval_, optvallen_, plain_username);

        case ZMQ_PLAIN_PASSWORD:
            return do_getsockopt (optval_, optvallen_, plain_password);

        case ZMQ_ZAP_DOMAIN:
            return do_getsockopt (optval_, optvallen_, zap_domain);

            //  If curve encryption isn't built, these options provoke EINVAL
#ifdef ZMQ_HAVE_CURVE
        case ZMQ_CURVE_SERVER:
            if (is_int) {
                *value = as_server && mechanism == ZMQ_CURVE;
                return 0;
            }
            break;

        case ZMQ_CURVE_PUBLICKEY:
            return do_getsockopt_curve_key (optval_, optvallen_,
                                            curve_public_key);

        case ZMQ_CURVE_SECRETKEY:
            return do_getsockopt_curve_key (optval_, optvallen_,
                                            curve_secret_key);

        case ZMQ_CURVE_SERVERKEY:
            return do_getsockopt_curve_key (optval_, optvallen_,
                                            curve_server_key);
#endif

        case ZMQ_CONFLATE:
            if (is_int) {
                *value = conflate;
                return 0;
            }
            break;

            //  If libgssapi isn't installed, these options provoke EINVAL
#ifdef HAVE_LIBGSSAPI_KRB5
        case ZMQ_GSSAPI_SERVER:
            if (is_int) {
                *value = as_server && mechanism == ZMQ_GSSAPI;
                return 0;
            }
            break;

        case ZMQ_GSSAPI_PRINCIPAL:
            return do_getsockopt (optval_, optvallen_, gss_principal);

        case ZMQ_GSSAPI_SERVICE_PRINCIPAL:
            return do_getsockopt (optval_, optvallen_, gss_service_principal);

        case ZMQ_GSSAPI_PLAINTEXT:
            if (is_int) {
                *value = gss_plaintext;
                return 0;
            }
            break;

        case ZMQ_GSSAPI_PRINCIPAL_NAMETYPE:
            if (is_int) {
                *value = gss_principal_nt;
                return 0;
            }
            break;
        case ZMQ_GSSAPI_SERVICE_PRINCIPAL_NAMETYPE:
            if (is_int) {
                *value = gss_service_principal_nt;
                return 0;
            }
            break;
#endif

        case ZMQ_HANDSHAKE_IVL:
            if (is_int) {
                *value = handshake_ivl;
                return 0;
            }
            break;

        case ZMQ_INVERT_MATCHING:
            if (is_int) {
                *value = invert_matching;
                return 0;
            }
            break;

        case ZMQ_HEARTBEAT_IVL:
            if (is_int) {
                *value = heartbeat_interval;
                return 0;
            }
            break;

        case ZMQ_HEARTBEAT_TTL:
            if (is_int) {
                // Convert the internal deciseconds value to milliseconds
                *value = heartbeat_ttl * 100;
                return 0;
            }
            break;

        case ZMQ_HEARTBEAT_TIMEOUT:
            if (is_int) {
                *value = heartbeat_timeout;
                return 0;
            }
            break;

        case ZMQ_USE_FD:
            if (is_int) {
                *value = use_fd;
                return 0;
            }
            break;

        case ZMQ_BINDTODEVICE:
            return do_getsockopt (optval_, optvallen_, bound_device);

        case ZMQ_ZAP_ENFORCE_DOMAIN:
            if (is_int) {
                *value = zap_enforce_domain;
                return 0;
            }
            break;

        case ZMQ_LOOPBACK_FASTPATH:
            if (is_int) {
                *value = loopback_fastpath;
                return 0;
            }
            break;

        case ZMQ_MULTICAST_LOOP:
            if (is_int) {
                *value = multicast_loop;
                return 0;
            }
            break;

#ifdef ZMQ_BUILD_DRAFT_API
        case ZMQ_ROUTER_NOTIFY:
            if (is_int) {
                *value = router_notify;
                return 0;
            }
            break;

        case ZMQ_IN_BATCH_SIZE:
            if (is_int) {
                *value = in_batch_size;
                return 0;
            }
            break;

        case ZMQ_OUT_BATCH_SIZE:
            if (is_int) {
                *value = out_batch_size;
                return 0;
            }
            break;

        case ZMQ_PRIORITY:
            if (is_int) {
                *value = priority;
                return 0;
            }
            break;
#endif


        default:
#if defined(ZMQ_ACT_MILITANT)
            malformed = false;
#endif
            break;
    }
#if defined(ZMQ_ACT_MILITANT)
    if (malformed)
        zmq_assert (false);
#endif
    errno = EINVAL;
    return -1;
}